

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# molly-test.cc
# Opt level: O0

int main(void)

{
  DeviceState DVar1;
  ostream *poVar2;
  int __oflag;
  DeviceState local_48;
  DeviceState state;
  DeviceState lastState;
  allocator local_31;
  string local_30 [32];
  Device local_10;
  undefined4 local_c;
  Device device;
  
  local_c = 0;
  molly::Device::Device(&local_10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"/dev/big_red_button",&local_31);
  molly::Device::open(&local_10,(char *)local_30,__oflag);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  local_48 = Unknown;
  while (DVar1 = molly::Device::sample(&local_10), DVar1 != LidClosed) {
    if (DVar1 == ButtonPressed) {
      if (local_48 != ButtonPressed) {
        poVar2 = std::operator<<((ostream *)&std::cout,"PRESS!!!");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      goto LAB_00102546;
    }
    if (DVar1 == LidOpen) {
      if ((local_48 != LidOpen) && (local_48 != ButtonPressed)) {
        poVar2 = std::operator<<((ostream *)&std::cout,"OPEN...");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
LAB_00102546:
      local_48 = DVar1;
      usleep(20000);
    }
  }
  if (local_48 != LidClosed) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Closed from ");
    poVar2 = molly::operator<<(poVar2,&local_48);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  goto LAB_00102546;
}

Assistant:

int main()
{
  Device device;
  device.open("/dev/big_red_button");

  DeviceState lastState = DeviceState::Unknown;

#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wmissing-noreturn"
  while (true)
  {
    DeviceState state = device.sample();

    switch (state)
    {
      case DeviceState::ButtonPressed:
        if (lastState != DeviceState::ButtonPressed)
          cout << "PRESS!!!" << endl;
        break;
      case DeviceState::LidOpen:
        if (lastState != DeviceState::LidOpen && lastState != DeviceState::ButtonPressed)
          cout << "OPEN..." << endl;
        break;
      case DeviceState::LidClosed:
        if (lastState != DeviceState::LidClosed)
          cout << "Closed from " << lastState << endl;
        break;
      default:
        continue;
    }

    lastState = state;

    usleep(20000);
  }
#pragma clang diagnostic pop
}